

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cpu.h
# Opt level: O2

Features Corrade::Cpu::runtimeFeatures(void)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint in_XCR0;
  
  lVar1 = cpuid_Version_info(1);
  uVar3 = *(uint *)(lVar1 + 4);
  uVar2 = *(uint *)(lVar1 + 0xc);
  uVar4 = uVar2 >> 7 & 0x10000 |
          uVar2 >> 0x10 & 0x18 |
          uVar2 >> 7 & 4 | (*(uint *)(lVar1 + 8) >> 0x1a & 1) + (uVar2 & 1) * 2;
  if ((~uVar2 & 0x18000000) == 0) {
    if ((~in_XCR0 & 6) == 0) {
      lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar3 = *(uint *)(lVar1 + 4);
      uVar4 = ((uVar3 & 8) << 0xf | (uVar2 & 0x1000) << 9 | (uVar2 & 0x20000000) >> 9) +
              (uVar3 & 0x20) * 2 | (uVar3 & 0x100) << 0xb | uVar4 | 0x20;
    }
    uVar2 = uVar4 | 0x80;
    if ((uVar3 & 0x10000) == 0) {
      uVar2 = uVar4;
    }
    if ((~in_XCR0 & 0xe6) == 0) {
      uVar4 = uVar2;
    }
  }
  lVar1 = cpuid(0x80000001);
  return (Features)(uVar4 | (*(uint *)(lVar1 + 0xc) & 0x20) << 0xc);
}

Assistant:

inline Features runtimeFeatures() {
    union {
        struct {
            unsigned int ax, bx, cx, dx;
        } e;
        int data[4];
    } cpuid{};

    Implementation::cpuid(cpuid.data, 1, 0);

    /* https://en.wikipedia.org/wiki/CPUID#EAX=1:_Processor_Info_and_Feature_Bits */
    unsigned int out = 0;
    if(cpuid.e.dx & (1 << 26)) out |= TypeTraits<Sse2T>::Index;
    if(cpuid.e.cx & (1 <<  0)) out |= TypeTraits<Sse3T>::Index;
    if(cpuid.e.cx & (1 <<  9)) out |= TypeTraits<Ssse3T>::Index;
    if(cpuid.e.cx & (1 << 19)) out |= TypeTraits<Sse41T>::Index;
    if(cpuid.e.cx & (1 << 20)) out |= TypeTraits<Sse42T>::Index;

    /* https://en.wikipedia.org/wiki/CPUID#EAX=80000001h:_Extended_Processor_Info_and_Feature_Bits,
       bit 5 says "ABM (lzcnt and popcnt)", but
       https://en.wikipedia.org/wiki/X86_Bit_manipulation_instruction_set#ABM_(Advanced_Bit_Manipulation)
       says that while LZCNT is advertised in the ABM CPUID bit, POPCNT is a
       separate CPUID flag. Get POPCNT first, ABM later. */
    if(cpuid.e.cx & (1 << 23)) out |= TypeTraits<PopcntT>::Index;

    /* AVX needs OS support checked, as the OS needs to be capable of saving
       and restoring the expanded registers when switching contexts:
       https://en.wikipedia.org/wiki/Advanced_Vector_Extensions#Operating_system_support */
    if((cpuid.e.cx & (1 << 27)) && /* XSAVE/XRESTORE CPU support */
       (cpuid.e.cx & (1 << 28)))   /* AVX CPU support */
    {
        /* XGETBV indicates that the registers will be properly saved and
           restored by the OS: https://stackoverflow.com/a/22521619. */

        /* https://github.com/vectorclass/version2/blob/ff7450acfad9d3a7c6825d92cfb782a42ccfa71f/instrset_detect.cpp#L30-L32
           Clang-cl as well, as it doesn't seem to know the MSVC intrinsics. */
        #if defined(CORRADE_TARGET_GCC) || defined(CORRADE_TARGET_CLANG_CL)
        unsigned int a, d;
        __asm("xgetbv": "=a"(a), "=d"(d): "c"(0): );
        const unsigned long long xgetbv = a|(static_cast<unsigned long long>(d) << 32);

        /* Declared at the top of the file */
        #elif defined(CORRADE_TARGET_MSVC)
        const unsigned long long xgetbv = _xgetbv(0);
        #else
        #error
        #endif

        /* If AVX is not supported, we don't check any following flags either */
        if((xgetbv & 0x06) == 0x06 /* XSTATE_SSE|XSTATE_YMM */) {
            out |= TypeTraits<AvxT>::Index;

            if(cpuid.e.cx & (1 << 29)) out |= TypeTraits<AvxF16cT>::Index;
            if(cpuid.e.cx & (1 << 12)) out |= TypeTraits<AvxFmaT>::Index;

            /* https://en.wikipedia.org/wiki/CPUID#EAX=7,_ECX=0:_Extended_Features */
            Implementation::cpuid(cpuid.data, 7, 0);
            if(cpuid.e.bx & (1 << 3)) out |= TypeTraits<Bmi1T>::Index;
            if(cpuid.e.bx & (1 << 5)) out |= TypeTraits<Avx2T>::Index;
            if(cpuid.e.bx & (1 << 8)) out |= TypeTraits<Bmi2T>::Index;
        }

        /* AVX-512 needs additional state saving support
            https://patchwork.ozlabs.org/project/gcc/patch/20180329124309.GA12667@intel.com/#1884915
            https://github.com/google/highway/blob/master/hwy/targets.cc#L279 */
        if((cpuid.e.bx & (1 << 16)) &&
           /* XSTATE_SSE|XSTATE_YMM|XSTATE_OPMASK|XSTATE_ZMM|XSTATE_HI_ZMM */
           (xgetbv & 0xe6) == 0xe6)
        {
            out |= TypeTraits<Avx512fT>::Index;
        }
    }

    /* And now the LZCNT bit, finally
       https://en.wikipedia.org/wiki/CPUID#EAX=80000001h:_Extended_Processor_Info_and_Feature_Bits */
    Implementation::cpuid(cpuid.data, 0x80000001, 0);
    if(cpuid.e.cx & (1 << 5)) out |= TypeTraits<LzcntT>::Index;

    return Features{out};
}